

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweep.c
# Opt level: O3

Gia_Obj_t * Gia_ManFraigMarkCos(Gia_Man_t *p,Gia_Obj_t *pObj,int fMark)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  int *piVar3;
  int iVar4;
  uint uVar5;
  Gia_Obj_t *pGVar6;
  Gia_Obj_t *pGVar7;
  
  if ((-1 < (int)(uint)*(undefined8 *)pObj) ||
     (pGVar6 = pObj, ((uint)*(undefined8 *)pObj & 0x1fffffff) == 0x1fffffff)) {
    __assert_fail("Gia_ObjIsCo(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSweep.c"
                  ,0xed,"Gia_Obj_t *Gia_ManFraigMarkCos(Gia_Man_t *, Gia_Obj_t *, int)");
  }
  do {
    if (fMark != 0) {
      pGVar2 = p->pObjs;
      if ((pGVar6 < pGVar2) || (pGVar2 + p->nObjs <= pGVar6)) {
LAB_0022e237:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      iVar4 = (int)((long)pObj - (long)pGVar2 >> 2) * -0x55555555;
      if (p->nTravIdsAlloc <= iVar4) {
LAB_0022e256:
        __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x262,"void Gia_ObjSetTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
      }
      iVar1 = p->nTravIds;
      piVar3 = p->pTravIds;
      piVar3[iVar4] = iVar1;
      uVar5 = (uint)*(undefined8 *)pGVar6 & 0x1fffffff;
      pGVar7 = (Gia_Obj_t *)((long)pGVar6 + (ulong)(uVar5 * 4) * -3);
      if ((pGVar7 < pGVar2) || (pGVar2 + p->nObjs <= pGVar7)) goto LAB_0022e237;
      iVar4 = (int)((long)(((long)pObj - (long)pGVar2) + (ulong)(uVar5 << 2) * -3) >> 2) *
              -0x55555555;
      if (p->nTravIdsAlloc <= iVar4) goto LAB_0022e256;
      piVar3[iVar4] = iVar1;
    }
    pGVar2 = pGVar6 + -1;
    pGVar6 = pGVar6 + -1;
    if ((-1 < (int)(uint)*(undefined8 *)pGVar2) ||
       (pObj = pObj + -1, ((uint)*(undefined8 *)pGVar2 & 0x1fffffff) == 0x1fffffff)) {
      return pGVar6;
    }
  } while( true );
}

Assistant:

Gia_Obj_t * Gia_ManFraigMarkCos( Gia_Man_t * p, Gia_Obj_t * pObj, int fMark )
{
    for ( assert( Gia_ObjIsCo(pObj) ); Gia_ObjIsCo(pObj); pObj-- )
        if ( fMark )
        {
            Gia_ObjSetTravIdCurrent( p, pObj );
            Gia_ObjSetTravIdCurrent( p, Gia_ObjFanin0(pObj) );
        }
    return pObj;
}